

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_fEf.cpp
# Opt level: O0

vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_> *
DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf
          (vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>
           *__return_storage_ptr__,MatrixXd *p1,MatrixXd *p2,Matrix3d *R1,Matrix3d *R2)

{
  Matrix<double,3,3,0,3,3> *this;
  Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>
  *__return_storage_ptr___00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *this_00;
  Index IVar7;
  double *pdVar8;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar9;
  CommaInitializer<Eigen::Matrix<double,_27,_1,_0,_27,_1>_> *pCVar10;
  Scalar *pSVar11;
  Index IVar12;
  Scalar *pSVar13;
  Scalar *pSVar14;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar15;
  double extraout_XMM0_Qa;
  double dVar16;
  Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> local_970;
  Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_950;
  Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::DiagonalMatrix<double,_3,_3>,_1>
  local_928;
  Scalar local_8e8;
  Scalar local_8e0;
  Scalar local_8d8;
  Scalar local_8d0;
  Scalar local_8c8;
  Scalar local_8c0;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_8b8;
  Nested local_898;
  Scalar local_890;
  double local_888;
  double local_880;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_878;
  ColXpr local_858;
  HouseholderSequenceType local_828;
  non_const_type local_800;
  undefined1 local_7f8 [8];
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> qr;
  int local_6b4;
  undefined1 local_6b0 [4];
  int i;
  Matrix3d skew_t;
  DiagonalMatrix<double,_3,_3> Kinv;
  Vector3d kinv;
  Matrix3d Q;
  RelPose relpose;
  undefined1 local_578 [8];
  Matrix3d M;
  double thresh;
  Vector4cd w;
  DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> local_4e0 [8];
  Matrix<double,_5,_1,_0,_5,_1> coeffs;
  ColXpr local_488;
  ColXpr local_458;
  ColXpr local_428;
  ColXpr local_3f8;
  ColXpr local_3c8;
  ColXpr local_398;
  ColXpr local_368;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> local_338 [48];
  CommaInitializer<Eigen::Matrix<double,_27,_1,_0,_27,_1>_> local_308;
  undefined1 local_2e8 [8];
  Matrix<double,_27,_1,_0,_27,_1> x;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  local_208;
  Matrix<double,3,3,0,3,3> local_1f8 [8];
  Matrix3d R;
  Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> local_190;
  VectorwiseOp<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> local_170;
  Nested local_168;
  VectorwiseOp<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> local_160;
  Nested local_158;
  Matrix<double,3,3,0,3,3> local_150 [8];
  Matrix3d x2;
  Matrix3d x1;
  DiagonalMatrix<double,3,3> local_b8 [8];
  DiagonalMatrix<double,_3,_3> S;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_88;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_68 [8];
  Vector3d s;
  double scale;
  double scale2;
  double scale1;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *pMStack_30;
  int nbr_pts;
  Matrix3d *R2_local;
  Matrix3d *R1_local;
  MatrixXd *p2_local;
  MatrixXd *p1_local;
  vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_> *output;
  
  scale1._4_4_ = 3;
  pMStack_30 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)R2;
  R2_local = R1;
  R1_local = (Matrix3d *)p2;
  p2_local = p1;
  p1_local = (MatrixXd *)__return_storage_ptr__;
  IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar7 != 2) {
    __assert_fail("p1.rows() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/fEf/get_fEf.cpp"
                  ,0x2d,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &)"
                 );
  }
  IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)R1_local);
  if (IVar7 != 2) {
    __assert_fail("p2.rows() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/fEf/get_fEf.cpp"
                  ,0x2e,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &)"
                 );
  }
  IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&p2_local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar7 != scale1._4_4_) {
    __assert_fail("p1.cols() == nbr_pts",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/fEf/get_fEf.cpp"
                  ,0x2f,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &)"
                 );
  }
  IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)R1_local);
  if (IVar7 != scale1._4_4_) {
    __assert_fail("p2.cols() == nbr_pts",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/fEf/get_fEf.cpp"
                  ,0x30,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021::get_fEf(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &)"
                 );
  }
  scale2 = normalize2dpts(p2_local);
  scale = normalize2dpts((MatrixXd *)R1_local);
  pdVar8 = std::max<double>(&scale2,&scale);
  s.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = *pdVar8
  ;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_68);
  pdVar8 = s.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 2
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<(&local_88,local_68,pdVar8);
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_88,pdVar8);
  S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (pCVar9,S.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array + 2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_88);
  x1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (double)Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::asDiagonal
                         ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_68);
  Eigen::DiagonalMatrix<double,3,3>::
  DiagonalMatrix<Eigen::DiagonalWrapper<Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_b8,(DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)(x1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + 8));
  this = (Matrix<double,3,3,0,3,3> *)
         (x2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 8
         );
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)this);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_150);
  local_160.m_matrix =
       (ExpressionTypeNested)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colwise
                 ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)p2_local);
  local_158 = (Nested)Eigen::VectorwiseOp<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                      homogeneous(&local_160);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            (this,(DenseBase<Eigen::Homogeneous<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                   *)&local_158);
  local_170.m_matrix =
       (ExpressionTypeNested)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colwise
                 ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)R1_local);
  local_168 = (Nested)Eigen::VectorwiseOp<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                      homogeneous(&local_170);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            (local_150,
             (DenseBase<Eigen::Homogeneous<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_> *)
             &local_168);
  Eigen::DiagonalBase<Eigen::DiagonalMatrix<double,3,3>>::operator*
            (&local_190,(DiagonalBase<Eigen::DiagonalMatrix<double,3,3>> *)local_b8,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            (this,(DenseBase<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>_>
                   *)&local_190);
  __return_storage_ptr___00 =
       (Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
       (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 8);
  Eigen::DiagonalBase<Eigen::DiagonalMatrix<double,3,3>>::operator*
            (__return_storage_ptr___00,(DiagonalBase<Eigen::DiagonalMatrix<double,3,3>> *)local_b8,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_150);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            (local_150,
             (DenseBase<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>_>
              *)__return_storage_ptr___00);
  this_00 = pMStack_30;
  x.super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>.m_storage.m_data.array[0x1a] =
       (double)Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)R2_local);
  local_208 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        (this_00,(MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  *)(x.
                                     super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>.
                                     m_storage.m_data.array + 0x1a));
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,0>>
            (local_1f8,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
              *)&local_208);
  Eigen::Matrix<double,_27,_1,_0,_27,_1>::Matrix((Matrix<double,_27,_1,_0,_27,_1> *)local_2e8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((ColXpr *)local_338,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,0);
  Eigen::DenseBase<Eigen::Matrix<double,27,1,0,27,1>>::operator<<
            (&local_308,(DenseBase<Eigen::Matrix<double,27,1,0,27,1>> *)local_2e8,local_338);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            (&local_368,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,1);
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)&local_308,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *
                       )&local_368);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            (&local_398,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             (x2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 8),2);
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar10,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *
                       )&local_398);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            (&local_3c8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_150,0);
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar10,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *
                       )&local_3c8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            (&local_3f8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_150,1);
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar10,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *
                       )&local_3f8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            (&local_428,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_150,2);
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar10,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *
                       )&local_428);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            (&local_458,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8,0);
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar10,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *
                       )&local_458);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            (&local_488,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8,1);
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar10,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *
                       )&local_488);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((ColXpr *)
             (coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
              array + 4),(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8,2);
  Eigen::CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,27,1,0,27,1>> *)pCVar10,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             (coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
              array + 4));
  Eigen::CommaInitializer<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>::~CommaInitializer(&local_308);
  calculate_coefficients
            ((Matrix<double,_5,_1,_0,_5,_1> *)local_4e0,(Matrix<double,_27,_1,_0,_27,_1> *)local_2e8
            );
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()(local_4e0,1)
  ;
  dVar16 = *pSVar11;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()(local_4e0,0)
  ;
  dVar1 = *pSVar11;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()(local_4e0,2)
  ;
  dVar2 = *pSVar11;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()(local_4e0,0)
  ;
  dVar3 = *pSVar11;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()(local_4e0,3)
  ;
  dVar4 = *pSVar11;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()(local_4e0,0)
  ;
  dVar5 = *pSVar11;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()(local_4e0,4)
  ;
  dVar6 = *pSVar11;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()(local_4e0,0)
  ;
  solve_quartic((Vector4cd *)&thresh,dVar16 / dVar1,dVar2 / dVar3,dVar4 / dVar5,dVar6 / *pSVar11);
  M.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1e-12;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_578);
  relpose.r._7_1_ = 0;
  std::vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>::vector
            (__return_storage_ptr__);
  RelPose::RelPose((RelPose *)
                   (Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 8));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             (kinv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
              .m_data.array + 2));
  Eigen::DiagonalMatrix<double,_3,_3>::DiagonalMatrix
            ((DiagonalMatrix<double,_3,_3> *)
             (skew_t.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 8));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_6b0);
  for (local_6b4 = 0;
      IVar12 = Eigen::EigenBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>_>::size
                         ((EigenBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>_> *)&thresh)
      , local_6b4 < IVar12; local_6b4 = local_6b4 + 1) {
    pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>::
              operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1> *)
                         &thresh,(long)local_6b4);
    std::imag<double>(pSVar13);
    std::abs((int)pSVar13);
    if (extraout_XMM0_Qa <
        M.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]) {
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>::
                operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1> *
                           )&thresh,(long)local_6b4);
      dVar16 = std::real<double>(pSVar13);
      create_M((Matrix3d *)&qr.m_det_pq,dVar16,(Matrix<double,_27,_1,_0,_27,_1> *)local_2e8);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)local_578,
                 (Matrix<double,_3,_3,_0,_3,_3> *)&qr.m_det_pq);
      local_800 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_578);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::
      colPivHouseholderQr((ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_7f8,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                          &local_800);
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::householderQ
                (&local_828,(ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_7f8)
      ;
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)
                 (kinv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>_>
                  *)&local_828);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                (&local_858,
                 (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 (kinv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),2);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 8),
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_858);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>::
                operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1> *
                           )&thresh,(long)local_6b4);
      dVar16 = std::real<double>(pSVar13);
      relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = dVar16 / s.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[2];
      local_880 = 1.0 / relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[2];
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
                (&local_878,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),&local_880);
      local_888 = 1.0 / relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[2];
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                         (&local_878,&local_888);
      local_890 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar9,&local_890);
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_878);
      local_898 = (Nested)Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::asDiagonal
                                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                     (Kinv.m_diagonal.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array + 2));
      Eigen::DiagonalMatrix<double,3,3>::operator=
                ((DiagonalMatrix<double,3,3> *)
                 (skew_t.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 8),
                 (DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_898);
      local_8c0 = 0.0;
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
                (&local_8b8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_6b0,&local_8c0
                );
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),2);
      local_8c8 = -*pSVar14;
      pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (&local_8b8,&local_8c8);
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),1);
      pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar15,pSVar14);
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),2);
      pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar15,pSVar14);
      local_8d0 = 0.0;
      pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar15,&local_8d0);
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),0);
      local_8d8 = -*pSVar14;
      pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar15,&local_8d8);
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),1);
      local_8e0 = -*pSVar14;
      pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar15,&local_8e0);
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),0);
      pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar15,pSVar14);
      local_8e8 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar15,&local_8e8);
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_8b8);
      Eigen::DiagonalBase<Eigen::DiagonalMatrix<double,3,3>>::operator*
                (&local_970,
                 (DiagonalBase<Eigen::DiagonalMatrix<double,3,3>> *)
                 (skew_t.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 8),(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_6b0);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>>
      ::operator*(&local_950,
                  (MatrixBase<Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>>
                   *)&local_970,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>,Eigen::Matrix<double,3,3,0,3,3>,0>>
      ::operator*(&local_928,
                  (MatrixBase<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                   *)&local_950,
                  (DiagonalBase<Eigen::DiagonalMatrix<double,_3,_3>_> *)
                  (skew_t.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array + 8));
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)
                 (Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 8),
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::DiagonalMatrix<double,_3,_3>,_1>_>
                  *)&local_928);
      std::vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>::push_back
                (__return_storage_ptr__,
                 (value_type *)
                 (Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 8));
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::~ColPivHouseholderQR
                ((ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_7f8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RelPose> get_fEf(
        const Eigen::MatrixXd &p1,
        const Eigen::MatrixXd &p2,
        const Eigen::Matrix3d &R1,
        const Eigen::Matrix3d &R2
    ) {
        // This is a 3-point method
        int nbr_pts = 3;

        // We expect inhomogenous input data, i.e. p1 and p2 are 2x3 matrices
        assert(p1.rows() == 2);
        assert(p2.rows() == 2);
        assert(p1.cols() == nbr_pts);
        assert(p2.cols() == nbr_pts);

        // Compute normalization matrix
        double scale1 = normalize2dpts(p1);
        double scale2 = normalize2dpts(p2);
        double scale = std::max(scale1, scale2);
        Eigen::Vector3d s;
        s << scale, scale, 1.0;
        Eigen::DiagonalMatrix<double, 3> S = s.asDiagonal();

        // Normalize data
        Eigen::Matrix3d x1;
        Eigen::Matrix3d x2;
        x1 = p1.colwise().homogeneous();
        x2 = p2.colwise().homogeneous();
        x1 = S * x1;
        x2 = S * x2;

        // Compute relative rotation
        Eigen::Matrix3d R = R2 * R1.transpose();

        Eigen::Matrix<double, 27, 1> x;
        x << x1.col(0), x1.col(1), x1.col(2),
             x2.col(0), x2.col(1), x2.col(2),
             R.col(0), R.col(1), R.col(2);

        Eigen::Matrix<double, 5, 1> coeffs = calculate_coefficients(x);

        Eigen::Vector4cd w  = solve_quartic(
            coeffs(1) / coeffs(0),
            coeffs(2) / coeffs(0),
            coeffs(3) / coeffs(0),
            coeffs(4) / coeffs(0));

        // Construct putative output
        double thresh = 1e-12;
        Eigen::Matrix3d M;
        std::vector<RelPose> output;
        RelPose relpose;
        Eigen::Matrix3d Q;
        Eigen::Vector3d kinv;
        Eigen::DiagonalMatrix<double, 3> Kinv;
        Eigen::Matrix3d skew_t;

        // Householder is just 500 ns slower than analytic, but is significantly more stable
        for (int i=0; i < w.size(); i++) {
            if (std::abs(std::imag(w[i])) < thresh) {
                M = create_M(std::real(w[i]), x);
                auto qr = M.transpose().colPivHouseholderQr();
                Q = qr.householderQ();
                relpose.t = Q.col(2);
                relpose.f = std::real(w[i]) / scale;

                // Compute fundamental matrix
                kinv << 1.0 / relpose.f, 1.0 / relpose.f, 1.0;
                Kinv = kinv.asDiagonal();
                skew_t << 0, -relpose.t(2), relpose.t(1),
                          relpose.t(2), 0, -relpose.t(0),
                         -relpose.t(1), relpose.t(0), 0;
                relpose.F = Kinv * skew_t * R * Kinv;

                output.push_back(relpose);
            }
        }

        return output;
    }